

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intraprocess_subscriber_link.cpp
# Opt level: O0

void __thiscall
miniros::IntraProcessSubscriberLink::setSubscriber
          (IntraProcessSubscriberLink *this,IntraProcessPublisherLinkPtr *subscriber)

{
  uint32_t uVar1;
  string *psVar2;
  shared_ptr<miniros::IntraProcessPublisherLink> *in_RSI;
  shared_ptr<miniros::IntraProcessPublisherLink> *in_RDI;
  ConnectionManager *unaff_retaddr;
  
  std::shared_ptr<miniros::IntraProcessPublisherLink>::operator=(in_RSI,in_RDI);
  ConnectionManager::instance();
  std::__shared_ptr_access<miniros::ConnectionManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<miniros::ConnectionManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x451ba5);
  uVar1 = ConnectionManager::getNewConnectionID(unaff_retaddr);
  *(uint32_t *)
   &in_RDI[2].super___shared_ptr<miniros::IntraProcessPublisherLink,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = uVar1;
  psVar2 = this_node::getName_abi_cxx11_();
  std::__cxx11::string::operator=((string *)(in_RDI + 3),(string *)psVar2);
  return;
}

Assistant:

void IntraProcessSubscriberLink::setSubscriber(const IntraProcessPublisherLinkPtr& subscriber)
{
  subscriber_ = subscriber;
  connection_id_ = ConnectionManager::instance()->getNewConnectionID();
  destination_caller_id_ = this_node::getName();
}